

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O1

void cram_stats_del(cram_stats *st,int32_t val)

{
  int *piVar1;
  uint uVar2;
  kh_m_i2i_t *pkVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  st->nsamp = st->nsamp + -1;
  if ((uint)val < 0x400) {
    iVar6 = st->freqs[(uint)val];
    st->freqs[(uint)val] = iVar6 + -1;
    if (iVar6 < 1) {
      __assert_fail("st->freqs[val] >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_stats.c"
                    ,0x55,"void cram_stats_del(cram_stats *, int32_t)");
    }
  }
  else {
    pkVar3 = st->h;
    if (pkVar3 == (kh_m_i2i_t *)0x0) {
      cram_stats_del_cold_2();
    }
    else {
      uVar2 = pkVar3->n_buckets;
      if (uVar2 == 0) {
        uVar8 = 0;
      }
      else {
        uVar7 = uVar2 - 1 & val;
        iVar6 = 1;
        uVar4 = uVar7;
        do {
          bVar5 = (char)uVar4 * '\x02' & 0x1e;
          uVar8 = pkVar3->flags[uVar4 >> 4] >> bVar5;
          if (((uVar8 & 2) != 0) || (((uVar8 & 1) == 0 && (pkVar3->keys[uVar4] == val)))) {
            uVar8 = uVar4;
            if ((pkVar3->flags[uVar4 >> 4] >> bVar5 & 3) != 0) {
              uVar8 = uVar2;
            }
            break;
          }
          uVar4 = uVar4 + iVar6 & uVar2 - 1;
          iVar6 = iVar6 + 1;
          uVar8 = uVar2;
        } while (uVar4 != uVar7);
      }
      if (uVar8 == uVar2) {
        cram_stats_del_cold_1();
      }
      else {
        piVar1 = pkVar3->vals + uVar8;
        *piVar1 = *piVar1 + -1;
        if ((*piVar1 == 0) && (pkVar3->n_buckets != uVar8)) {
          uVar2 = pkVar3->flags[uVar8 >> 4];
          uVar4 = uVar8 * 2 & 0x1e;
          if ((uVar2 >> (sbyte)uVar4 & 3) == 0) {
            pkVar3->flags[uVar8 >> 4] = uVar2 | 1 << uVar4;
            pkVar3->size = pkVar3->size - 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cram_stats_del(cram_stats *st, int32_t val) {
    st->nsamp--;

    //assert(val >= 0);

    if (val < MAX_STAT_VAL && val >= 0) {
	st->freqs[val]--;
	assert(st->freqs[val] >= 0);
    } else if (st->h) {
	khint_t k = kh_get(m_i2i, st->h, val);

	if (k != kh_end(st->h)) {
	    if (--kh_val(st->h, k) == 0)
		kh_del(m_i2i, st->h, k);
	} else {
	    fprintf(stderr, "Failed to remove val %d from cram_stats\n", val);
	    st->nsamp++;
	}
    } else {
	fprintf(stderr, "Failed to remove val %d from cram_stats\n", val);
	st->nsamp++;
    }
}